

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

StkId luaF_close(lua_State *L,StkId level,TStatus status,int yy)

{
  StkId func;
  StkId pSVar1;
  TValue *pTVar2;
  StkId pSVar3;
  long lVar4;
  TValue *io1;
  StkId tbc;
  
  lVar4 = (long)level - (L->stack).offset;
  luaF_closeupval(L,level);
  do {
    pSVar3 = (L->tbclist).p;
    if (pSVar3 < level) {
      return level;
    }
    for (pSVar1 = pSVar3 + -(ulong)(pSVar3->tbclist).delta;
        ((L->stack).p < pSVar1 && ((pSVar1->tbclist).delta == 0)); pSVar1 = pSVar1 + -0xffff) {
    }
    (L->tbclist).p = pSVar1;
    if (status == '\x06') {
LAB_0010c26d:
      pSVar1 = (StkId)0x0;
    }
    else {
      if (status == '\0') {
        (L->top).p = pSVar3 + 1;
        goto LAB_0010c26d;
      }
      pSVar1 = pSVar3 + 1;
      luaD_seterrorobj(L,status,pSVar1);
    }
    func = (L->top).p;
    pTVar2 = luaT_gettmbyobj(L,&pSVar3->val,TM_CLOSE);
    (func->val).value_ = pTVar2->value_;
    (func->val).tt_ = pTVar2->tt_;
    func[1].val.value_ = (pSVar3->val).value_;
    *(lu_byte *)((long)func + 0x18) = (pSVar3->val).tt_;
    if (pSVar1 == (StkId)0x0) {
      pSVar3 = func + 2;
    }
    else {
      pSVar3 = func + 3;
      func[2].val.value_ = (pSVar1->val).value_;
      *(lu_byte *)((long)func + 0x28) = (pSVar1->val).tt_;
    }
    (L->top).p = pSVar3;
    if (yy == 0) {
      luaD_callnoyield(L,func,0);
    }
    else {
      luaD_call(L,func,0);
    }
    level = (StkId)((long)(L->stack).p + lVar4);
  } while( true );
}

Assistant:

StkId luaF_close (lua_State *L, StkId level, TStatus status, int yy) {
  ptrdiff_t levelrel = savestack(L, level);
  luaF_closeupval(L, level);  /* first, close the upvalues */
  while (L->tbclist.p >= level) {  /* traverse tbc's down to that level */
    StkId tbc = L->tbclist.p;  /* get variable index */
    poptbclist(L);  /* remove it from list */
    prepcallclosemth(L, tbc, status, yy);  /* close variable */
    level = restorestack(L, levelrel);
  }
  return level;
}